

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_gencall(ASMState *as,CCallInfo *ci,IRRef *args)

{
  uint uVar1;
  uint r_00;
  MCode *pMVar2;
  uint uVar3;
  Reg RVar4;
  long in_RDX;
  x86Op xo;
  long *in_RSI;
  ASMState *in_RDI;
  Reg r;
  IRIns *ir;
  IRRef ref;
  MCode *patchnfpr;
  Reg fpr;
  uint32_t gprs;
  int32_t ofs;
  uint32_t nargs;
  uint32_t n;
  RegSet in_stack_ffffffffffffffa8;
  MCode *in_stack_ffffffffffffffb0;
  IRIns *as_00;
  int32_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ASMState *as_01;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar5;
  uint local_30;
  int local_2c;
  uint local_24;
  
  uVar1 = *(uint *)(in_RSI + 1);
  local_2c = 0;
  local_30 = 0x128088c7;
  uVar5 = 0x10;
  as_01 = (ASMState *)0x0;
  if (*in_RSI != 0) {
    emit_call_((ASMState *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb0);
  }
  if ((*(uint *)(in_RSI + 1) & 0x800) != 0) {
    as_01 = (ASMState *)(in_RDI->mcp + -1);
    in_RDI->mcp = (MCode *)as_01;
    pMVar2 = in_RDI->mcp;
    in_RDI->mcp = pMVar2 + -1;
    pMVar2[-1] = 0xb0;
  }
  local_24 = 0;
  while( true ) {
    if ((uVar1 & 0xff) <= local_24) {
      if (as_01 != (ASMState *)0x0) {
        *(char *)as_01->cost = (char)uVar5 + -0x10;
      }
      return;
    }
    r_00 = *(uint *)(in_RDX + (ulong)local_24 * 4);
    as_00 = in_RDI->ir + r_00;
    if ((((as_00->field_1).t.irt & 0x1f) == 0xe) || (((as_00->field_1).t.irt & 0x1f) == 0xd)) {
      if (uVar5 < 0x18) {
        in_stack_ffffffffffffffa8 = uVar5;
        uVar3 = uVar5;
        uVar5 = uVar5 + 1;
      }
      else {
        in_stack_ffffffffffffffa8 = 0;
        uVar3 = in_stack_ffffffffffffffa8;
      }
    }
    else {
      uVar3 = local_30 & 0x1f;
      local_30 = local_30 >> 5;
    }
    if (uVar3 == 0) {
      if ((((as_00->field_1).t.irt & 0x1f) == 0xe) || (((as_00->field_1).t.irt & 0x1f) == 0xd)) {
        RVar4 = ra_alloc1((ASMState *)&as_00->field_0,0,in_stack_ffffffffffffffa8);
        xo = XO_MOVSSto;
        if (((as_00->field_1).t.irt & 0x1f) == 0xe) {
          xo = XO_MOVSDto;
        }
        emit_rmro(in_RDI,xo,RVar4,4,local_2c);
      }
      else {
        RVar4 = ra_alloc1((ASMState *)&as_00->field_0,0,in_stack_ffffffffffffffa8);
        emit_rmro(in_RDI,XO_MOVto,RVar4 + 0x80200,4,local_2c);
      }
      local_2c = local_2c + 8;
    }
    else if ((uVar3 < 0x10) && (r_00 < 0x7ffd)) {
      if ((as_00->field_1).o == '\x1c') {
        emit_loadu64((ASMState *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                     (Reg)((ulong)as_01 >> 0x20),CONCAT44(r_00,in_stack_ffffffffffffffb8));
      }
      else {
        emit_loadi(as_01,r_00,in_stack_ffffffffffffffb8);
      }
    }
    else if (((as_00->field_1).r & 0x80) == 0) {
      in_RDI->weakset = (1 << ((as_00->field_1).r & 0x1f) ^ 0xffffffffU) & in_RDI->weakset;
      emit_movrr((ASMState *)&as_00->field_0,(IRIns *)CONCAT44(uVar3,in_stack_ffffffffffffffa8),0,
                 0x17d5c1);
    }
    else {
      ra_allocref((ASMState *)CONCAT44(r_00,in_stack_ffffffffffffffb8),(IRRef)((ulong)as_00 >> 0x20)
                  ,(RegSet)as_00);
    }
    if (in_RDI->mcp < in_RDI->mclim) break;
    local_24 = local_24 + 1;
  }
  asm_mclimit((ASMState *)0x17d6db);
}

Assistant:

static void asm_gencall(ASMState *as, const CCallInfo *ci, IRRef *args)
{
  uint32_t n, nargs = CCI_NARGS(ci);
  int32_t ofs = STACKARG_OFS;
#if LJ_64
  uint32_t gprs = REGARG_GPRS;
  Reg fpr = REGARG_FIRSTFPR;
#if !LJ_ABI_WIN
  MCode *patchnfpr = NULL;
#endif
#else
  uint32_t gprs = 0;
  if ((ci->flags & CCI_CC_MASK) != CCI_CC_CDECL) {
    if ((ci->flags & CCI_CC_MASK) == CCI_CC_THISCALL)
      gprs = (REGARG_GPRS & 31);
    else if ((ci->flags & CCI_CC_MASK) == CCI_CC_FASTCALL)
      gprs = REGARG_GPRS;
  }
#endif
  if ((void *)ci->func)
    emit_call(as, ci->func);
#if LJ_64
  if ((ci->flags & CCI_VARARG)) {  /* Special handling for vararg calls. */
#if LJ_ABI_WIN
    for (n = 0; n < 4 && n < nargs; n++) {
      IRIns *ir = IR(args[n]);
      if (irt_isfp(ir->t))  /* Duplicate FPRs in GPRs. */
	emit_rr(as, XO_MOVDto, (irt_isnum(ir->t) ? REX_64 : 0) | (fpr+n),
		((gprs >> (n*5)) & 31));  /* Either MOVD or MOVQ. */
    }
#else
    patchnfpr = --as->mcp;  /* Indicate number of used FPRs in register al. */
    *--as->mcp = XI_MOVrib | RID_EAX;
#endif
  }
#endif
  for (n = 0; n < nargs; n++) {  /* Setup args. */
    IRRef ref = args[n];
    IRIns *ir = IR(ref);
    Reg r;
#if LJ_64 && LJ_ABI_WIN
    /* Windows/x64 argument registers are strictly positional. */
    r = irt_isfp(ir->t) ? (fpr <= REGARG_LASTFPR ? fpr : 0) : (gprs & 31);
    fpr++; gprs >>= 5;
#elif LJ_64
    /* POSIX/x64 argument registers are used in order of appearance. */
    if (irt_isfp(ir->t)) {
      r = fpr <= REGARG_LASTFPR ? fpr++ : 0;
    } else {
      r = gprs & 31; gprs >>= 5;
    }
#else
    if (ref && irt_isfp(ir->t)) {
      r = 0;
    } else {
      r = gprs & 31; gprs >>= 5;
      if (!ref) continue;
    }
#endif
    if (r) {  /* Argument is in a register. */
      if (r < RID_MAX_GPR && ref < ASMREF_TMP1) {
#if LJ_64
	if (ir->o == IR_KINT64)
	  emit_loadu64(as, r, ir_kint64(ir)->u64);
	else
#endif
	  emit_loadi(as, r, ir->i);
      } else {
	lua_assert(rset_test(as->freeset, r));  /* Must have been evicted. */
	if (ra_hasreg(ir->r)) {
	  ra_noweak(as, ir->r);
	  emit_movrr(as, ir, r, ir->r);
	} else {
	  ra_allocref(as, ref, RID2RSET(r));
	}
      }
    } else if (irt_isfp(ir->t)) {  /* FP argument is on stack. */
      lua_assert(!(irt_isfloat(ir->t) && irref_isk(ref)));  /* No float k. */
      if (LJ_32 && (ofs & 4) && irref_isk(ref)) {
	/* Split stores for unaligned FP consts. */
	emit_movmroi(as, RID_ESP, ofs, (int32_t)ir_knum(ir)->u32.lo);
	emit_movmroi(as, RID_ESP, ofs+4, (int32_t)ir_knum(ir)->u32.hi);
      } else {
	r = ra_alloc1(as, ref, RSET_FPR);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSDto : XO_MOVSSto,
		  r, RID_ESP, ofs);
      }
      ofs += (LJ_32 && irt_isfloat(ir->t)) ? 4 : 8;
    } else {  /* Non-FP argument is on stack. */
      if (LJ_32 && ref < ASMREF_TMP1) {
	emit_movmroi(as, RID_ESP, ofs, ir->i);
      } else {
	r = ra_alloc1(as, ref, RSET_GPR);
	emit_movtomro(as, REX_64 + r, RID_ESP, ofs);
      }
      ofs += sizeof(intptr_t);
    }
    checkmclim(as);
  }
#if LJ_64 && !LJ_ABI_WIN
  if (patchnfpr) *patchnfpr = fpr - REGARG_FIRSTFPR;
#endif
}